

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     sort3<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>,std::less<std::tuple<long,int,int,int>>>
               (tuple<long,_int,_int,_int> *a,tuple<long,_int,_int,_int> *b,
               tuple<long,_int,_int,_int> *c)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = std::
          __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
          ::__less(b,a);
  if (bVar3) {
    lVar2 = (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>.
            _M_head_impl;
    (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>._M_head_impl
         = (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>.
           _M_head_impl;
    (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>._M_head_impl
         = lVar2;
    iVar1 = (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl;
    (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Head_base<1UL,_int,_false>._M_head_impl =
         (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
         super__Head_base<1UL,_int,_false>._M_head_impl;
    (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Head_base<1UL,_int,_false>._M_head_impl = iVar1;
    iVar1 = (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
            super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
    (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
         (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
         super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
    (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl = iVar1;
    iVar1 = (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
            super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
            super__Head_base<3UL,_int,_false>._M_head_impl;
    (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
    _M_head_impl = (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                   super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
    (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
    _M_head_impl = iVar1;
  }
  bVar3 = std::
          __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
          ::__less(c,b);
  if (bVar3) {
    lVar2 = (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>.
            _M_head_impl;
    (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>._M_head_impl
         = (c->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>.
           _M_head_impl;
    (c->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>._M_head_impl
         = lVar2;
    iVar1 = (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl;
    (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Head_base<1UL,_int,_false>._M_head_impl =
         (c->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
         super__Head_base<1UL,_int,_false>._M_head_impl;
    (c->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Head_base<1UL,_int,_false>._M_head_impl = iVar1;
    iVar1 = (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
            super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
    (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
         (c->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
         super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
    (c->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl = iVar1;
    iVar1 = (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
            super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
            super__Head_base<3UL,_int,_false>._M_head_impl;
    (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
    _M_head_impl = (c->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                   super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
    (c->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
    _M_head_impl = iVar1;
  }
  bVar3 = std::
          __tuple_compare<std::tuple<long,_int,_int,_int>,_std::tuple<long,_int,_int,_int>,_0UL,_4UL>
          ::__less(b,a);
  if (bVar3) {
    lVar2 = (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>.
            _M_head_impl;
    (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>._M_head_impl
         = (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>.
           _M_head_impl;
    (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Head_base<0UL,_long,_false>._M_head_impl
         = lVar2;
    iVar1 = (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl;
    (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Head_base<1UL,_int,_false>._M_head_impl =
         (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
         super__Head_base<1UL,_int,_false>._M_head_impl;
    (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Head_base<1UL,_int,_false>._M_head_impl = iVar1;
    iVar1 = (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
            super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
    (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
         (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
         super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
    (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl = iVar1;
    iVar1 = (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
            super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
            super__Head_base<3UL,_int,_false>._M_head_impl;
    (a->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
    _M_head_impl = (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).
                   super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                   super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
    (b->super__Tuple_impl<0UL,_long,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int,_int>.
    super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
    _M_head_impl = iVar1;
  }
  return;
}

Assistant:

inline void sort3(Iter a, Iter b, Iter c, Compare comp) {
        sort2(a, b, comp);
        sort2(b, c, comp);
        sort2(a, b, comp);
    }